

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestCharReaderTestparseWithStackLimit::runTestCase(TestCharReaderTestparseWithStackLimit *this)

{
  TestResult *result;
  int iVar1;
  Value *pVVar2;
  CharReader *pCVar3;
  string errs;
  char doc [25];
  Value root;
  CharReaderBuilder b;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [16];
  char local_128 [40];
  Value local_100;
  CharReaderBuilder local_d8;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::CharReaderBuilder::CharReaderBuilder(&local_d8);
  Json::Value::Value(&local_100,nullValue);
  builtin_strncpy(local_128 + 0x10,"value\" }",9);
  builtin_strncpy(local_128,"{ \"property\" : \"",0x10);
  Json::Value::Value(&local_58,2);
  pVVar2 = Json::Value::operator[](&local_d8.settings_,"stackLimit");
  Json::Value::operator=(pVVar2,&local_58);
  Json::Value::~Value(&local_58);
  pCVar3 = Json::CharReaderBuilder::newCharReader(&local_d8);
  local_140 = 0;
  local_138[0] = 0;
  local_148 = local_138;
  iVar1 = (*pCVar3->_vptr_CharReader[2])(pCVar3,local_128,local_128 + 0x18,&local_100,&local_148);
  if ((char)iVar1 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x74f,"ok");
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_148);
  if (iVar1 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x750,"errs == \"\"");
  }
  result = (this->super_CharReaderTest).super_TestCase.result_;
  pVVar2 = Json::Value::operator[](&local_100,"property");
  Json::Value::Value(&local_80,pVVar2);
  JsonTest::checkEqual<char_const*,Json::Value>
            (result,"value",&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x751,"\"value\" == root[\"property\"]");
  Json::Value::~Value(&local_80);
  (*pCVar3->_vptr_CharReader[1])(pCVar3);
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  Json::Value::Value(&local_a8,1);
  pVVar2 = Json::Value::operator[](&local_d8.settings_,"stackLimit");
  Json::Value::operator=(pVVar2,&local_a8);
  Json::Value::~Value(&local_a8);
  pCVar3 = Json::CharReaderBuilder::newCharReader(&local_d8);
  local_140 = 0;
  local_138[0] = 0;
  local_148 = local_138;
  (*pCVar3->_vptr_CharReader[2])(pCVar3,local_128,local_128 + 0x18,&local_100);
  JsonTest::TestResult::addFailure
            ((this->super_CharReaderTest).super_TestCase.result_,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x75a,
             "expected exception thrown: reader->parse( doc, doc + std::strlen(doc), &root, &errs)")
  ;
  (*pCVar3->_vptr_CharReader[1])(pCVar3);
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  Json::Value::~Value(&local_100);
  Json::CharReaderBuilder::~CharReaderBuilder(&local_d8);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithStackLimit) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "{ \"property\" : \"value\" }";
  {
  b.settings_["stackLimit"] = 2;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs == "");
  JSONTEST_ASSERT_EQUAL("value", root["property"]);
  delete reader;
  }
  {
  b.settings_["stackLimit"] = 1;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  JSONTEST_ASSERT_THROWS(reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs));
  delete reader;
  }
}